

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_red.c
# Opt level: O1

void zzRedCrandMont(word *a,word *mod,size_t n,word mont_param,void *stack)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  word wVar4;
  size_t sVar5;
  ulong uVar6;
  word wVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (n == 0) {
    uVar8 = 0;
    wVar4 = 0;
    uVar9 = 0;
  }
  else {
    wVar7 = *a;
    sVar5 = 0;
    wVar4 = 0;
    uVar8 = 0;
    do {
      uVar6 = wVar7 * mont_param;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar6;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = -*mod;
      puVar1 = a + n + sVar5;
      uVar9 = *puVar1;
      *puVar1 = *puVar1 + uVar6 + uVar8;
      uVar8 = (ulong)(CARRY8(uVar9,uVar6 + uVar8) || CARRY8(uVar6,uVar8));
      uVar9 = SUB168(auVar2 * auVar3,8) + wVar4;
      uVar6 = a[sVar5 + 1];
      wVar7 = uVar6 - uVar9;
      a[sVar5 + 1] = wVar7;
      sVar5 = sVar5 + 1;
      wVar4 = (word)(uVar6 < uVar9);
    } while (n != sVar5);
  }
  wVar4 = zzSubW2(a + n + 1,n - 1,wVar4);
  if (n != 0) {
    sVar5 = 0;
    do {
      uVar6 = a[n + sVar5];
      a[sVar5] = uVar6;
      uVar9 = (ulong)((uint)uVar9 & (uint)(mod[sVar5] == uVar6)) | (ulong)(mod[sVar5] < uVar6);
      sVar5 = sVar5 + 1;
    } while (n != sVar5);
  }
  zzSubAndW(a,mod,n,-(uVar8 - wVar4 | uVar9));
  return;
}

Assistant:

void SAFE(zzRedCrandMont)(word a[], const word mod[], size_t n, 
	register word mont_param, void* stack)
{
	register word carry = 0;
	register word borrow = 0;
	register word w = 0;
	register dword prod;
	size_t i;
	// pre
	ASSERT(wwIsDisjoint2(a, 2 * n, mod, n));
	ASSERT(n >= 2 && mod[0] % 2  && wwIsRepW(mod + 1, n - 1, WORD_MAX));
	ASSERT((word)(mod[0] * mont_param + 1) == 0);
	// редукция
	for (i = 0; i < n; ++i)
	{
		zzMul11Lo(w, a[i], mont_param);
		zzMul11(prod, w, WORD_0 - mod[0]);
		w += carry;
		carry = wordLess01(w, carry);
		a[i + n] += w;
		carry |= wordLess01(a[i + n], w); 
		w = (word)(prod >> B_PER_W);
		w += borrow;
		borrow = wordLess01(w, borrow);
		borrow |= wordLess01(a[i + 1], w);
		a[i + 1] -= w;
	}
	// a <- a - borrow * B^{n + 1}
	carry -= zzSubW2(a + n + 1, n - 1, borrow);
	// a <- a / B^n, a >= mod?
	for (i = 0; i < n; ++i)
	{
		a[i] = a[n + i];
		w &= wordEq01(mod[i], a[i]);
		w |= wordLess01(mod[i], a[i]);
	}
	w |= carry, w = WORD_0 - w;
	zzSubAndW(a, mod, n, w);
	// очистка
	prod = 0;
	carry = borrow = w = 0;
}